

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O3

uint64_t FastSLog2Slow_C(uint32_t v)

{
  uint uVar1;
  int iVar2;
  byte bVar3;
  ulong uVar4;
  double dVar5;
  
  if (v < 0x10000) {
    uVar1 = 0x1f;
    if (v != 0) {
      for (; v >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar2 = (uVar1 ^ 0xffffffe0) + 0x19;
    bVar3 = (byte)iVar2;
    return ((long)iVar2 * 0x800000 + (ulong)kLog2Table[v >> (bVar3 & 0x1f)]) * (ulong)v +
           (ulong)(~(-1 << (bVar3 & 0x1f)) & v) * 0xb8aa3b;
  }
  dVar5 = log((double)v);
  dVar5 = dVar5 * (double)v * 12102203.161561485 + 0.5;
  uVar4 = (ulong)dVar5;
  return (long)(dVar5 - 9.223372036854776e+18) & (long)uVar4 >> 0x3f | uVar4;
}

Assistant:

static uint64_t FastSLog2Slow_C(uint32_t v) {
  assert(v >= LOG_LOOKUP_IDX_MAX);
  if (v < APPROX_LOG_WITH_CORRECTION_MAX) {
    const uint64_t orig_v = v;
    uint64_t correction;
#if !defined(WEBP_HAVE_SLOW_CLZ_CTZ)
    // use clz if available
    const uint64_t log_cnt = BitsLog2Floor(v) - 7;
    const uint32_t y = 1 << log_cnt;
    v >>= log_cnt;
#else
    uint64_t log_cnt = 0;
    uint32_t y = 1;
    do {
      ++log_cnt;
      v = v >> 1;
      y = y << 1;
    } while (v >= LOG_LOOKUP_IDX_MAX);
#endif
    // vf = (2^log_cnt) * Xf; where y = 2^log_cnt and Xf < 256
    // Xf = floor(Xf) * (1 + (v % y) / v)
    // log2(Xf) = log2(floor(Xf)) + log2(1 + (v % y) / v)
    // The correction factor: log(1 + d) ~ d; for very small d values, so
    // log2(1 + (v % y) / v) ~ LOG_2_RECIPROCAL * (v % y)/v
    correction = LOG_2_RECIPROCAL_FIXED * (orig_v & (y - 1));
    return orig_v * (kLog2Table[v] + (log_cnt << LOG_2_PRECISION_BITS)) +
           correction;
  } else {
    return (uint64_t)(LOG_2_RECIPROCAL_FIXED_DOUBLE * v * log((double)v) + .5);
  }
}